

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

void __thiscall
imrt::Station::updateIntensity
          (Station *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  _List_node_base *p_Var1;
  double *pdVar2;
  pair<int,_int> pVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  
  if ((diff->super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
      _M_impl._M_node._M_size != 0) {
    for (p_Var1 = (diff->
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next; p_Var1 != (_List_node_base *)diff
        ; p_Var1 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                     )&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      pVar3 = Collimator::indexToPos(this->collimator,*(int *)&p_Var1[1]._M_next,this->angle);
      iVar6 = pVar3.first;
      pdVar2 = (this->I).p[iVar6];
      lVar5 = (long)pVar3 >> 0x20;
      dVar7 = pdVar2[lVar5] + (double)p_Var1[1]._M_prev;
      pdVar2[lVar5] = dVar7;
      if (dVar7 < 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR INTENSIDAD NEGATIVA EN updateIntensity!!!!",0x30);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,pVar3.second);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-> ",3);
        poVar4 = std::ostream::_M_insert<double>((double)p_Var1[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," is ",4);
        poVar4 = std::ostream::_M_insert<double>
                           (*(this->intensity).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::ostream::_M_insert<double>((this->I).p[iVar6][lVar5]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        getchar();
      }
    }
  }
  return;
}

Assistant:

void Station::updateIntensity(list<pair<int,double> > diff) {
    pair<int,int> coord;
    if (diff.size()<1){ 
      return; 
    }
    for (auto it=diff.begin(); it!=diff.end(); it++) {
      coord = collimator.indexToPos(it->first, angle);
      I(coord.first,coord.second) = I(coord.first,coord.second) + it->second;
      if (I(coord.first,coord.second) < 0) { 
        cout <<"ERROR INTENSIDAD NEGATIVA EN updateIntensity!!!!" << coord.first<<
          ","<<coord.second << "-> "<< it->second << " is " << 
            getApertureIntensity(0) << " " << I(coord.first,coord.second)<<endl;
        getchar();
      }
    }
  }